

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_to_montgomery(uint64_t *out1,uint64_t *arg1)

{
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  uint64_t x202;
  uint64_t x201;
  uint64_t x200;
  uint64_t x199;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x198;
  uint64_t x197;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x196;
  uint64_t x195;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x194;
  uint64_t x193;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x192;
  uint64_t x191;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x190;
  uint64_t x189;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x188;
  uint64_t x187;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x186;
  uint64_t x185;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x184;
  uint64_t x183;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x182;
  uint64_t x181;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x180;
  uint64_t x179;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x178;
  uint64_t x177;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x176;
  uint64_t x175;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x174;
  uint64_t x173;
  uint64_t x172;
  uint64_t x171;
  uint64_t x170;
  uint64_t x169;
  uint64_t x168;
  uint64_t x167;
  uint64_t x166;
  uint64_t x165;
  uint64_t x164;
  uint64_t x163;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x162;
  uint64_t x161;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x160;
  uint64_t x159;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x158;
  uint64_t x157;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x156;
  uint64_t x155;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x154;
  uint64_t x153;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x152;
  uint64_t x151;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x150;
  uint64_t x149;
  uint64_t x148;
  uint64_t x147;
  uint64_t x146;
  uint64_t x145;
  uint64_t x144;
  uint64_t x143;
  uint64_t x142;
  uint64_t x141;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x140;
  uint64_t x139;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x138;
  uint64_t x137;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x136;
  uint64_t x135;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x134;
  uint64_t x133;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x132;
  uint64_t x131;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x130;
  uint64_t x129;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x128;
  uint64_t x127;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x126;
  uint64_t x125;
  uint64_t x124;
  uint64_t x123;
  uint64_t x122;
  uint64_t x121;
  uint64_t x120;
  uint64_t x119;
  uint64_t x118;
  uint64_t x117;
  uint64_t x116;
  uint64_t x115;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x114;
  uint64_t x113;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x112;
  uint64_t x111;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x110;
  uint64_t x109;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x108;
  uint64_t x107;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x106;
  uint64_t x105;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x104;
  uint64_t x103;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x102;
  uint64_t x101;
  uint64_t x100;
  uint64_t x99;
  uint64_t x98;
  uint64_t x97;
  uint64_t x96;
  uint64_t x95;
  uint64_t x94;
  uint64_t x93;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x92;
  uint64_t x91;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x90;
  uint64_t x89;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x88;
  uint64_t x87;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x86;
  uint64_t x85;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x84;
  uint64_t x83;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x82;
  uint64_t x81;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x80;
  uint64_t x79;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x78;
  uint64_t x77;
  uint64_t x76;
  uint64_t x75;
  uint64_t x74;
  uint64_t x73;
  uint64_t x72;
  uint64_t x71;
  uint64_t x70;
  uint64_t x69;
  uint64_t x68;
  uint64_t x67;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x66;
  uint64_t x65;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x64;
  uint64_t x63;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x62;
  uint64_t x61;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x60;
  uint64_t x59;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x58;
  uint64_t x57;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x56;
  uint64_t x55;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x54;
  uint64_t x53;
  uint64_t x52;
  uint64_t x51;
  uint64_t x50;
  uint64_t x49;
  uint64_t x48;
  uint64_t x47;
  uint64_t x46;
  uint64_t x45;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x44;
  uint64_t x43;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x42;
  uint64_t x41;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x40;
  uint64_t x39;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x38;
  uint64_t x37;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x36;
  uint64_t x35;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x34;
  uint64_t x33;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x32;
  uint64_t x31;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x30;
  uint64_t x29;
  uint64_t x28;
  uint64_t x27;
  uint64_t x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  uint64_t x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x18;
  uint64_t x17;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x16;
  uint64_t x15;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x14;
  uint64_t x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t local_660;
  uint64_t local_658;
  uint64_t local_650;
  uint64_t in_stack_fffffffffffff9b8;
  uint64_t in_stack_fffffffffffff9c0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 in_stack_fffffffffffff9cf;
  undefined7 in_stack_fffffffffffff9d0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 in_stack_fffffffffffff9d7;
  uint64_t local_628;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_619;
  uint64_t local_618;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_609;
  uint64_t local_608;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_5f9;
  uint64_t local_5f8;
  byte local_5e9;
  uint64_t local_5e8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_5d9;
  uint64_t local_5d8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_5c9;
  uint64_t local_5c8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_5b9;
  uint64_t local_5b8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_5a9;
  uint64_t local_5a8;
  byte local_599;
  uint64_t local_598;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_589;
  uint64_t local_588;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_579;
  uint64_t local_578;
  uint64_t local_570;
  uint64_t local_568;
  uint64_t local_560;
  uint64_t local_558;
  uint64_t local_550;
  uint64_t local_548;
  uint64_t local_540;
  uint64_t local_538;
  uint64_t local_530;
  uint64_t local_528;
  byte local_519;
  uint64_t local_518;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_509;
  uint64_t local_508;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_4f9;
  uint64_t local_4f8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_4e9;
  uint64_t local_4e8;
  byte local_4d9;
  uint64_t local_4d8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_4c9;
  uint64_t local_4c8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_4b9;
  uint64_t local_4b8;
  uint64_t local_4b0;
  uint64_t local_4a8;
  uint64_t local_4a0;
  uint64_t local_498;
  uint64_t local_490;
  uint64_t local_488;
  uint64_t local_480;
  uint64_t local_478;
  byte local_469;
  uint64_t local_468;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_459;
  uint64_t local_458;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_449;
  uint64_t local_448;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_439;
  uint64_t local_438;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_429;
  uint64_t local_428;
  byte local_419;
  uint64_t local_418;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_409;
  uint64_t local_408;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3f9;
  uint64_t local_3f8;
  uint64_t local_3f0;
  uint64_t local_3e8;
  uint64_t local_3e0;
  uint64_t local_3d8;
  uint64_t local_3d0;
  uint64_t local_3c8;
  uint64_t local_3c0;
  uint64_t local_3b8;
  uint64_t local_3b0;
  uint64_t local_3a8;
  byte local_399;
  uint64_t local_398;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_389;
  uint64_t local_388;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_379;
  uint64_t local_378;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_369;
  uint64_t local_368;
  byte local_359;
  uint64_t local_358;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_349;
  uint64_t local_348;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_339;
  uint64_t local_338;
  uint64_t local_330;
  uint64_t local_328;
  uint64_t local_320;
  uint64_t local_318;
  uint64_t local_310;
  uint64_t local_308;
  uint64_t local_300;
  uint64_t local_2f8;
  byte local_2e9;
  uint64_t local_2e8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2d9;
  uint64_t local_2d8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2c9;
  uint64_t local_2c8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2b9;
  uint64_t local_2b8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2a9;
  uint64_t local_2a8;
  byte local_299;
  uint64_t local_298;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_289;
  uint64_t local_288;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_279;
  uint64_t local_278;
  uint64_t local_270;
  uint64_t local_268;
  uint64_t local_260;
  uint64_t local_258;
  uint64_t local_250;
  uint64_t local_248;
  uint64_t local_240;
  uint64_t local_238;
  uint64_t local_230;
  uint64_t local_228;
  byte local_219;
  uint64_t local_218;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_209;
  uint64_t local_208;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1f9;
  uint64_t local_1f8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1e9;
  uint64_t local_1e8;
  byte local_1d9;
  uint64_t local_1d8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1c9;
  uint64_t local_1c8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1b9;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  uint64_t local_198;
  uint64_t local_190;
  uint64_t local_188;
  uint64_t local_180;
  uint64_t local_178;
  byte local_169;
  uint64_t local_168;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_159;
  uint64_t local_158;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_149;
  uint64_t local_148;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_139;
  uint64_t local_138;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_129;
  uint64_t local_128;
  byte local_119;
  uint64_t local_118;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_109;
  uint64_t local_108;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_f9;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t local_b0;
  uint64_t local_a8;
  byte local_99;
  uint64_t local_98;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_89;
  uint64_t local_88;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_79;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  uint64_t *local_8;
  
  local_18 = in_RSI[1];
  local_20 = in_RSI[2];
  local_28 = in_RSI[3];
  local_30 = *in_RSI;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_38,&local_40,local_30,0x807a394ede097652);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_48,&local_50,local_30,0x186304212849c07b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_58,&local_60,local_30,0x1017bb39c2d346c5);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_68,&local_70,local_30,0x409973b4c427fcea);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_78,&local_79,'\0',local_70,local_58);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_88,&local_89,local_79,local_60,local_48);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_98,&local_99,local_89,local_50,local_38);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_a8,&local_b0,local_68,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_b8,&local_c0,local_a8,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_c8,&local_d0,local_a8,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_d8,&local_e0,local_a8,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_e8,&local_f0,local_a8,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_f8,&local_f9,'\0',local_f0,local_d8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_108,&local_109,local_f9,local_e0,local_c8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_118,&local_119,local_109,local_d0,local_b8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_128,&local_129,'\0',local_68,local_e8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_138,&local_139,local_129,local_78,local_f8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_148,&local_149,local_139,local_88,local_108);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_158,&local_159,local_149,local_98,local_118);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_168,&local_169,local_159,local_99 + local_40,local_119 + local_c0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_178,&local_180,local_18,0x807a394ede097652);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_188,&local_190,local_18,0x186304212849c07b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_198,&local_1a0,local_18,0x1017bb39c2d346c5);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_1a8,&local_1b0,local_18,0x409973b4c427fcea);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1b8,&local_1b9,'\0',local_1b0,local_198);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1c8,&local_1c9,local_1b9,local_1a0,local_188);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1d8,&local_1d9,local_1c9,local_190,local_178);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1e8,&local_1e9,'\0',local_138,local_1a8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1f8,&local_1f9,local_1e9,local_148,local_1b8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_208,&local_209,local_1f9,local_158,local_1c8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_218,&local_219,local_209,local_168,local_1d8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_228,&local_230,local_1e8,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_238,&local_240,local_228,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_248,&local_250,local_228,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_258,&local_260,local_228,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_268,&local_270,local_228,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_278,&local_279,'\0',local_270,local_258);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_288,&local_289,local_279,local_260,local_248);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_298,&local_299,local_289,local_250,local_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2a8,&local_2a9,'\0',local_1e8,local_268);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2b8,&local_2b9,local_2a9,local_1f8,local_278);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2c8,&local_2c9,local_2b9,local_208,local_288);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2d8,&local_2d9,local_2c9,local_218,local_298);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2e8,&local_2e9,local_2d9,
             (ulong)local_219 + (ulong)local_169 + local_1d9 + local_180,local_299 + local_240);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_2f8,&local_300,local_20,0x807a394ede097652);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_308,&local_310,local_20,0x186304212849c07b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_318,&local_320,local_20,0x1017bb39c2d346c5);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_328,&local_330,local_20,0x409973b4c427fcea);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_338,&local_339,'\0',local_330,local_318);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_348,&local_349,local_339,local_320,local_308);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_358,&local_359,local_349,local_310,local_2f8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_368,&local_369,'\0',local_2b8,local_328);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_378,&local_379,local_369,local_2c8,local_338);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_388,&local_389,local_379,local_2d8,local_348);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_398,&local_399,local_389,local_2e8,local_358);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_3a8,&local_3b0,local_368,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_3b8,&local_3c0,local_3a8,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_3c8,&local_3d0,local_3a8,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_3d8,&local_3e0,local_3a8,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_3e8,&local_3f0,local_3a8,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3f8,&local_3f9,'\0',local_3f0,local_3d8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_408,&local_409,local_3f9,local_3e0,local_3c8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_418,&local_419,local_409,local_3d0,local_3b8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_428,&local_429,'\0',local_368,local_3e8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_438,&local_439,local_429,local_378,local_3f8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_448,&local_449,local_439,local_388,local_408);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_458,&local_459,local_449,local_398,local_418);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_468,&local_469,local_459,
             (ulong)local_399 + (ulong)local_2e9 + local_359 + local_300,local_419 + local_3c0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_478,&local_480,local_28,0x807a394ede097652);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_488,&local_490,local_28,0x186304212849c07b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_498,&local_4a0,local_28,0x1017bb39c2d346c5);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_4a8,&local_4b0,local_28,0x409973b4c427fcea);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4b8,&local_4b9,'\0',local_4b0,local_498);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4c8,&local_4c9,local_4b9,local_4a0,local_488);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4d8,&local_4d9,local_4c9,local_490,local_478);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4e8,&local_4e9,'\0',local_438,local_4a8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4f8,&local_4f9,local_4e9,local_448,local_4b8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_508,&local_509,local_4f9,local_458,local_4c8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_518,&local_519,local_509,local_468,local_4d8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_528,&local_530,local_4e8,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_538,&local_540,local_528,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_548,&local_550,local_528,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_558,&local_560,local_528,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_568,&local_570,local_528,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_578,&local_579,'\0',local_570,local_558);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_588,&local_589,local_579,local_560,local_548);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_598,&local_599,local_589,local_550,local_538);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_5a8,&local_5a9,'\0',local_4e8,local_568);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_5b8,&local_5b9,local_5a9,local_4f8,local_578);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_5c8,&local_5c9,local_5b9,local_508,local_588);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_5d8,&local_5d9,local_5c9,local_518,local_598);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_5e8,&local_5e9,local_5d9,
             (ulong)local_519 + (ulong)local_469 + local_4d9 + local_480,local_599 + local_540);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_5f8,&local_5f9,'\0',local_5b8,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_608,&local_609,local_5f9,local_5c8,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_618,&local_619,local_609,local_5d8,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_628,&stack0xfffffffffffff9d7,local_619,local_5e8,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffff9c8,&stack0xfffffffffffff9c7,in_stack_fffffffffffff9d7
             ,(ulong)local_5e9,0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
             in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
             in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
             in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
             in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  *local_8 = in_stack_fffffffffffff9b8;
  local_8[1] = local_650;
  local_8[2] = local_658;
  local_8[3] = local_660;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_to_montgomery(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x30;
    uint64_t x31;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x32;
    uint64_t x33;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x34;
    uint64_t x35;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x36;
    uint64_t x37;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x38;
    uint64_t x39;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x40;
    uint64_t x41;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x42;
    uint64_t x43;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x54;
    uint64_t x55;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x56;
    uint64_t x57;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x58;
    uint64_t x59;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x60;
    uint64_t x61;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x62;
    uint64_t x63;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x64;
    uint64_t x65;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x66;
    uint64_t x67;
    uint64_t x68;
    uint64_t x69;
    uint64_t x70;
    uint64_t x71;
    uint64_t x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    uint64_t x77;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x78;
    uint64_t x79;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x80;
    uint64_t x81;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x82;
    uint64_t x83;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x84;
    uint64_t x85;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x86;
    uint64_t x87;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x88;
    uint64_t x89;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x90;
    uint64_t x91;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x92;
    uint64_t x93;
    uint64_t x94;
    uint64_t x95;
    uint64_t x96;
    uint64_t x97;
    uint64_t x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x102;
    uint64_t x103;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x104;
    uint64_t x105;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x106;
    uint64_t x107;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x108;
    uint64_t x109;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x110;
    uint64_t x111;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x112;
    uint64_t x113;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x114;
    uint64_t x115;
    uint64_t x116;
    uint64_t x117;
    uint64_t x118;
    uint64_t x119;
    uint64_t x120;
    uint64_t x121;
    uint64_t x122;
    uint64_t x123;
    uint64_t x124;
    uint64_t x125;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x126;
    uint64_t x127;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x128;
    uint64_t x129;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x130;
    uint64_t x131;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x132;
    uint64_t x133;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x134;
    uint64_t x135;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x136;
    uint64_t x137;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x138;
    uint64_t x139;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x140;
    uint64_t x141;
    uint64_t x142;
    uint64_t x143;
    uint64_t x144;
    uint64_t x145;
    uint64_t x146;
    uint64_t x147;
    uint64_t x148;
    uint64_t x149;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x150;
    uint64_t x151;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x152;
    uint64_t x153;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x154;
    uint64_t x155;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x156;
    uint64_t x157;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x158;
    uint64_t x159;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x160;
    uint64_t x161;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x162;
    uint64_t x163;
    uint64_t x164;
    uint64_t x165;
    uint64_t x166;
    uint64_t x167;
    uint64_t x168;
    uint64_t x169;
    uint64_t x170;
    uint64_t x171;
    uint64_t x172;
    uint64_t x173;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x174;
    uint64_t x175;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x176;
    uint64_t x177;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x178;
    uint64_t x179;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x180;
    uint64_t x181;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x182;
    uint64_t x183;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x184;
    uint64_t x185;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x186;
    uint64_t x187;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x188;
    uint64_t x189;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x190;
    uint64_t x191;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x192;
    uint64_t x193;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x194;
    uint64_t x195;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x196;
    uint64_t x197;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x198;
    uint64_t x199;
    uint64_t x200;
    uint64_t x201;
    uint64_t x202;
    x1 = (arg1[1]);
    x2 = (arg1[2]);
    x3 = (arg1[3]);
    x4 = (arg1[0]);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x5, &x6, x4, UINT64_C(0x807a394ede097652));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x7, &x8, x4, UINT64_C(0x186304212849c07b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x9, &x10, x4, UINT64_C(0x1017bb39c2d346c5));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x11, &x12, x4, UINT64_C(0x409973b4c427fcea));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x13, &x14, 0x0,
                                                              x12, x9);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x15, &x16, x14,
                                                              x10, x7);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x17, &x18, x16,
                                                              x8, x5);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x19, &x20, x11, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x21, &x22, x19, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x23, &x24, x19, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x25, &x26, x19, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x27, &x28, x19, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x29, &x30, 0x0,
                                                              x28, x25);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x31, &x32, x30,
                                                              x26, x23);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x33, &x34, x32,
                                                              x24, x21);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x35, &x36, 0x0,
                                                              x11, x27);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x37, &x38, x36,
                                                              x13, x29);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x39, &x40, x38,
                                                              x15, x31);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x41, &x42, x40,
                                                              x17, x33);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x43, &x44, x42, (x18 + x6), (x34 + x22));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x45, &x46, x1, UINT64_C(0x807a394ede097652));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x47, &x48, x1, UINT64_C(0x186304212849c07b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x49, &x50, x1, UINT64_C(0x1017bb39c2d346c5));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x51, &x52, x1, UINT64_C(0x409973b4c427fcea));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x53, &x54, 0x0,
                                                              x52, x49);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x55, &x56, x54,
                                                              x50, x47);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x57, &x58, x56,
                                                              x48, x45);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x59, &x60, 0x0,
                                                              x37, x51);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x61, &x62, x60,
                                                              x39, x53);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x63, &x64, x62,
                                                              x41, x55);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x65, &x66, x64,
                                                              x43, x57);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x67, &x68, x59, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x69, &x70, x67, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x71, &x72, x67, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x73, &x74, x67, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x75, &x76, x67, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x77, &x78, 0x0,
                                                              x76, x73);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x79, &x80, x78,
                                                              x74, x71);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x81, &x82, x80,
                                                              x72, x69);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x83, &x84, 0x0,
                                                              x59, x75);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x85, &x86, x84,
                                                              x61, x77);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x87, &x88, x86,
                                                              x63, x79);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x89, &x90, x88,
                                                              x65, x81);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x91, &x92, x90, (((uint64_t)x66 + x44) + (x58 + x46)), (x82 + x70));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x93, &x94, x2, UINT64_C(0x807a394ede097652));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x95, &x96, x2, UINT64_C(0x186304212849c07b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x97, &x98, x2, UINT64_C(0x1017bb39c2d346c5));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x99, &x100, x2, UINT64_C(0x409973b4c427fcea));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x101, &x102, 0x0,
                                                              x100, x97);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x103, &x104,
                                                              x102, x98, x95);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x105, &x106,
                                                              x104, x96, x93);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x107, &x108, 0x0,
                                                              x85, x99);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x109, &x110,
                                                              x108, x87, x101);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x111, &x112,
                                                              x110, x89, x103);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x113, &x114,
                                                              x112, x91, x105);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x115, &x116, x107, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x117, &x118, x115, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x119, &x120, x115, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x121, &x122, x115, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x123, &x124, x115, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x125, &x126, 0x0,
                                                              x124, x121);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x127, &x128,
                                                              x126, x122, x119);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x129, &x130,
                                                              x128, x120, x117);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x131, &x132, 0x0,
                                                              x107, x123);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x133, &x134,
                                                              x132, x109, x125);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x135, &x136,
                                                              x134, x111, x127);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x137, &x138,
                                                              x136, x113, x129);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x139, &x140, x138, (((uint64_t)x114 + x92) + (x106 + x94)),
        (x130 + x118));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x141, &x142, x3, UINT64_C(0x807a394ede097652));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x143, &x144, x3, UINT64_C(0x186304212849c07b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x145, &x146, x3, UINT64_C(0x1017bb39c2d346c5));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x147, &x148, x3, UINT64_C(0x409973b4c427fcea));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x149, &x150, 0x0,
                                                              x148, x145);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x151, &x152,
                                                              x150, x146, x143);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x153, &x154,
                                                              x152, x144, x141);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x155, &x156, 0x0,
                                                              x133, x147);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x157, &x158,
                                                              x156, x135, x149);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x159, &x160,
                                                              x158, x137, x151);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x161, &x162,
                                                              x160, x139, x153);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x163, &x164, x155, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x165, &x166, x163, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x167, &x168, x163, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x169, &x170, x163, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x171, &x172, x163, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x173, &x174, 0x0,
                                                              x172, x169);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x175, &x176,
                                                              x174, x170, x167);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x177, &x178,
                                                              x176, x168, x165);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x179, &x180, 0x0,
                                                              x155, x171);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x181, &x182,
                                                              x180, x157, x173);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x183, &x184,
                                                              x182, x159, x175);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x185, &x186,
                                                              x184, x161, x177);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x187, &x188, x186, (((uint64_t)x162 + x140) + (x154 + x142)),
        (x178 + x166));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x189, &x190, 0x0, x181, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x191, &x192, x190, x183, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x193, &x194, x192, x185, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x195, &x196, x194, x187, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x197, &x198,
                                                               x196, x188, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x199, x198, x189,
                                                            x181);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x200, x198, x191,
                                                            x183);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x201, x198, x193,
                                                            x185);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x202, x198, x195,
                                                            x187);
    out1[0] = x199;
    out1[1] = x200;
    out1[2] = x201;
    out1[3] = x202;
}